

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.cpp
# Opt level: O1

optional<uint256> *
node::ReadSnapshotBaseBlockhash(optional<uint256> *__return_storage_ptr__,path chaindir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string_view source_file;
  char cVar3;
  bool bVar4;
  int iVar5;
  Logger *pLVar6;
  size_t in_RCX;
  path *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char *flag;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string read_from_str;
  path read_from;
  uint256 base_blockhash;
  Level level;
  char *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  long *local_168 [2];
  long local_158 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  path local_128;
  path local_100 [3];
  undefined1 local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = std::filesystem::status((path *)in_RSI);
  if ((cVar3 == -1) || (cVar3 == '\0')) {
    pcVar2 = (in_RSI->_M_pathname)._M_dataplus._M_p;
    paVar1 = &local_100[0]._M_pathname.field_2;
    local_100[0]._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,pcVar2,pcVar2 + (in_RSI->_M_pathname)._M_string_length);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/utxo_snapshot.cpp"
    ;
    source_file_00._M_len = 0x5f;
    logging_function_00._M_str = "ReadSnapshotBaseBlockhash";
    logging_function_00._M_len = 0x19;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_00,0x35,
               IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|PRUNE|SELECTCOINS|ADDRMAN|WALLETDB|NET,
               (Level)local_100,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100[0]._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_100[0]._M_pathname._M_dataplus._M_p,
                      local_100[0]._M_pathname.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = false;
    goto LAB_00992ff0;
  }
  std::filesystem::__cxx11::path::path(&local_128,in_RSI);
  std::filesystem::__cxx11::path::operator/=(&local_128,(path *)SNAPSHOT_BLOCKHASH_FILENAME);
  std::filesystem::__cxx11::path::path(local_100,&local_128);
  std::filesystem::__cxx11::path::~path(&local_128);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,local_100[0]._M_pathname._M_dataplus._M_p,
             local_100[0]._M_pathname._M_dataplus._M_p + local_100[0]._M_pathname._M_string_length);
  cVar3 = std::filesystem::status((path *)local_100);
  if ((cVar3 == -1) || (cVar3 == '\0')) {
    pcVar2 = (in_RSI->_M_pathname)._M_dataplus._M_p;
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,pcVar2,pcVar2 + (in_RSI->_M_pathname)._M_string_length);
    pLVar6 = LogInstance();
    bVar4 = BCLog::Logger::Enabled(pLVar6);
    if (bVar4) {
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity =
           local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                ((string *)local_78,
                 (tinyformat *)
                 "[snapshot] snapshot chainstate dir is malformed! no base blockhash file exists at path %s. Try deleting %s and calling loadtxoutset again?\n"
                 ,(char *)local_168,&local_148,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      if ((FILE *)local_78._0_8_ != (FILE *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
      }
      pLVar6 = LogInstance();
      local_78._0_8_ = (FILE *)0x5f;
      local_78._8_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/utxo_snapshot.cpp"
      ;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/utxo_snapshot.cpp"
      ;
      source_file._M_len = 0x5f;
      str._M_str = local_58._M_dataplus._M_p;
      str._M_len = local_58._M_string_length;
      logging_function._M_str = "ReadSnapshotBaseBlockhash";
      logging_function._M_len = 0x19;
      BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0x3e,ALL,Info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_168[0] != local_158) {
      operator_delete(local_168[0],local_158[0] + 1);
    }
    (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = false;
  }
  else {
    local_58.field_2._M_allocated_capacity = 0;
    local_58.field_2._8_8_ = 0;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_78._0_8_ = fsbridge::fopen((char *)local_100,"rb");
    local_78._8_8_ = (pointer)0x0;
    local_78._16_8_ = (pointer)0x0;
    local_78._24_8_ = (pointer)0x0;
    level = (Level)&local_148;
    if ((FILE *)local_78._0_8_ == (FILE *)0x0) {
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/utxo_snapshot.cpp"
      ;
      source_file_01._M_len = 0x5f;
      logging_function_01._M_str = "ReadSnapshotBaseBlockhash";
      logging_function_01._M_len = 0x19;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_01,source_file_01,0x47,
                 IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|PRUNE|SELECTCOINS|ADDRMAN|ESTIMATEFEE
                 |BENCH|HTTP|NET,level,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
      bVar4 = false;
    }
    else {
      AutoFile::read((AutoFile *)local_78,(int)&local_58,(void *)0x20,in_RCX);
      iVar5 = fgetc((FILE *)local_78._0_8_);
      if (iVar5 == -1) {
        iVar5 = ferror((FILE *)local_78._0_8_);
        if (iVar5 != 0) {
          flag = "[snapshot] warning: i/o error reading %s\n";
          iVar5 = 0x4f;
          goto LAB_00992f7f;
        }
      }
      else {
        flag = "[snapshot] warning: unexpected trailing data in %s\n";
        iVar5 = 0x4d;
LAB_00992f7f:
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/utxo_snapshot.cpp"
        ;
        source_file_02._M_len = 0x5f;
        logging_function_02._M_str = "ReadSnapshotBaseBlockhash";
        logging_function_02._M_len = 0x19;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_02,source_file_02,iVar5,(LogFlags)flag,level,
                   in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x10) =
           local_58.field_2._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x18) = local_58.field_2._8_8_;
      *(pointer *)
       &(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
        super__Optional_payload_base<uint256>._M_payload = local_58._M_dataplus._M_p;
      *(size_type *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 8) = local_58._M_string_length;
      bVar4 = true;
    }
    (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = bVar4;
    AutoFile::~AutoFile((AutoFile *)local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(local_100);
LAB_00992ff0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint256> ReadSnapshotBaseBlockhash(fs::path chaindir)
{
    if (!fs::exists(chaindir)) {
        LogPrintf("[snapshot] cannot read base blockhash: no chainstate dir "
            "exists at path %s\n", fs::PathToString(chaindir));
        return std::nullopt;
    }
    const fs::path read_from = chaindir / node::SNAPSHOT_BLOCKHASH_FILENAME;
    const std::string read_from_str = fs::PathToString(read_from);

    if (!fs::exists(read_from)) {
        LogPrintf("[snapshot] snapshot chainstate dir is malformed! no base blockhash file "
            "exists at path %s. Try deleting %s and calling loadtxoutset again?\n",
            fs::PathToString(chaindir), read_from_str);
        return std::nullopt;
    }

    uint256 base_blockhash;
    FILE* file{fsbridge::fopen(read_from, "rb")};
    AutoFile afile{file};
    if (afile.IsNull()) {
        LogPrintf("[snapshot] failed to open base blockhash file for reading: %s\n",
            read_from_str);
        return std::nullopt;
    }
    afile >> base_blockhash;

    if (std::fgetc(afile.Get()) != EOF) {
        LogPrintf("[snapshot] warning: unexpected trailing data in %s\n", read_from_str);
    } else if (std::ferror(afile.Get())) {
        LogPrintf("[snapshot] warning: i/o error reading %s\n", read_from_str);
    }
    return base_blockhash;
}